

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall
fasttext::Loss::findKBest(Loss *this,int32_t k,real threshold,Predictions *heap,Vector *output)

{
  pointer *pppVar1;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __first;
  undefined4 extraout_var;
  long lVar2;
  long lVar3;
  real rVar4;
  float x;
  pair<float,_int> local_38;
  
  lVar2 = 0;
  lVar3 = 0;
  do {
    if ((long)(output->data_).size_ <= lVar3) {
      return;
    }
    x = (output->data_).mem_[lVar3];
    if (threshold <= x) {
      if ((long)(heap->
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(heap->
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3 == (long)k) {
        rVar4 = std_log(x);
        if (rVar4 < ((heap->
                     super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->first) goto LAB_00143b3a;
        x = (output->data_).mem_[lVar3];
      }
      rVar4 = std_log(x);
      local_38 = (pair<float,_int>)(CONCAT44(extraout_var,rVar4) + lVar2);
      std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
      emplace_back<std::pair<float,int>>
                ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,&local_38
                );
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                ((heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start,
                 (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish,comparePairs);
      __last._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      __first._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(long)k < (ulong)((long)__last._M_current - (long)__first._M_current >> 3)) {
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  (__first,__last,comparePairs);
        pppVar1 = &(heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + -1;
      }
    }
LAB_00143b3a:
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x100000000;
  } while( true );
}

Assistant:

void Loss::findKBest(
    int32_t k,
    real threshold,
    Predictions& heap,
    const Vector& output) const {
  for (int32_t i = 0; i < output.size(); i++) {
    if (output[i] < threshold) {
      continue;
    }
    if (heap.size() == k && std_log(output[i]) < heap.front().first) {
      continue;
    }
    heap.push_back(std::make_pair(std_log(output[i]), i));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}